

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcActionRequest::IfcActionRequest(IfcActionRequest *this)

{
  *(undefined ***)&this->field_0x110 = &PTR__Object_008048a0;
  *(undefined8 *)&this->field_0x118 = 0;
  *(char **)&this->field_0x120 = "IfcActionRequest";
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__00874de0);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcActionRequest,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x874d00;
  *(undefined8 *)&this->field_0x110 = 0x874dc8;
  *(undefined8 *)&this->field_0x88 = 0x874d28;
  *(undefined8 *)&this->field_0x98 = 0x874d50;
  *(undefined8 *)&this->field_0xd0 = 0x874d78;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcActionRequest,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x874da0;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcActionRequest,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcActionRequest,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcActionRequest,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcActionRequest,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcActionRequest() : Object("IfcActionRequest") {}